

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RegistrarForTagAliases::RegistrarForTagAliases
          (RegistrarForTagAliases *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  SourceLineInfo *pSVar1;
  char *pcVar2;
  IMutableRegistryHub *pIVar3;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  SourceLineInfo *local_28;
  SourceLineInfo *lineInfo_local;
  char *tag_local;
  char *alias_local;
  RegistrarForTagAliases *this_local;
  
  local_28 = lineInfo;
  lineInfo_local = (SourceLineInfo *)tag;
  tag_local = alias;
  alias_local = (char *)this;
  pIVar3 = getMutableRegistryHub();
  pcVar2 = tag_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar2,&local_49);
  pSVar1 = lineInfo_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,(char *)pSVar1,&local_81);
  (*pIVar3->_vptr_IMutableRegistryHub[6])(pIVar3,local_48,local_80,local_28);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

RegistrarForTagAliases::RegistrarForTagAliases( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {
        getMutableRegistryHub().registerTagAlias( alias, tag, lineInfo );
    }